

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void node_accept_pattern(ACT_NODE_t *nod,AC_PATTERN_t *new_patt,int copy)

{
  size_t sVar1;
  int iVar2;
  int in_EDX;
  ACT_NODE_t *in_RSI;
  ACT_NODE_t *in_RDI;
  AC_PATTERN_t *patt;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar2 = node_has_pattern(in_RDI,(AC_PATTERN_t *)in_RSI);
  if (iVar2 == 0) {
    if (in_RDI->matched_size == in_RDI->matched_capacity) {
      node_grow_matched_vector((ACT_NODE_t *)0x1149c6);
    }
    sVar1 = in_RDI->matched_size;
    in_RDI->matched_size = sVar1 + 1;
    if (in_EDX == 0) {
      memcpy(in_RDI->matched + sVar1,in_RSI,0x30);
    }
    else {
      node_copy_pattern(in_RSI,(AC_PATTERN_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                        in_RDI->matched + sVar1);
    }
  }
  return;
}

Assistant:

void node_accept_pattern (ACT_NODE_t *nod, AC_PATTERN_t *new_patt, int copy)
{
    AC_PATTERN_t *patt;
    
    /* Check if the new pattern already exists in the node list */
    if (node_has_pattern(nod, new_patt))
        return;
    
    /* Manage memory */
    if (nod->matched_size == nod->matched_capacity)
        node_grow_matched_vector (nod);
    
    patt = &nod->matched[nod->matched_size++];
    
    if (copy)
    {
        /* Deep copy */
        node_copy_pattern (nod, patt, new_patt);
    }
    else
    {
        /* Shallow copy */
        *patt = *new_patt;
    }
}